

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator *this,cmGlobalGenerator *gen)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined8 local_20;
  char *local_18;
  
  if ((gen->ConfiguredFilesPath)._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->ConfiguredFilesPath);
    return;
  }
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(gen->CMakeInstance);
  local_30._M_str = (psVar1->_M_dataplus)._M_p;
  local_30._M_len = psVar1->_M_string_length;
  local_20 = 0xb;
  local_18 = "/CMakeFiles";
  views._M_len = 2;
  views._M_array = &local_30;
  cmCatViews_abi_cxx11_(&local_50,views);
  std::__cxx11::string::operator=((string *)&this->ConfiguredFilesPath,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator* gen)
{
  if (!gen->ConfiguredFilesPath.empty()) {
    this->ConfiguredFilesPath = gen->ConfiguredFilesPath;
  } else {
    this->ConfiguredFilesPath =
      cmStrCat(gen->CMakeInstance->GetHomeOutputDirectory(), "/CMakeFiles");
  }
}